

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::set_size
          (RepeatedField<unsigned_int> *this,bool is_soo,int size)

{
  int iVar1;
  string *psVar2;
  void *ptr;
  RepeatedField<unsigned_long> *this_00;
  long lVar3;
  Chunk *pCVar4;
  __base_type _Var5;
  int iVar6;
  undefined7 in_register_00000031;
  LongSooRep *this_01;
  SooRep *this_02;
  Arena *this_03;
  Arena *pAStack_90;
  long lStack_88;
  SooRep *pSStack_80;
  undefined1 auStack_78 [24];
  __atomic_base<long> _Stack_60;
  atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*> aStack_58;
  SooRep SStack_48;
  char *pcStack_38;
  Chunk *pCStack_30;
  LongSooRep LStack_28;
  
  this_01 = &LStack_28;
  pCVar4 = (Chunk *)(CONCAT71(in_register_00000031,is_soo) & 0xffffffff);
  iVar6 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar6 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar6 < size) {
    pCStack_30 = (Chunk *)0x266a0d;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)size,(long)iVar6,"size <= Capacity(is_soo)");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    internal::SooRep::set_size(&this->soo_rep_,SUB81(pCVar4,0),size);
    return;
  }
  pCStack_30 = (Chunk *)RepeatedField<unsigned_long>::elements;
  set_size();
  _Var5._M_p = (__pointer_type)((ulong)psVar2 & 0xffffffff);
  iVar6 = 1;
  if ((int)psVar2 == 0) {
    iVar6 = this_01->capacity;
  }
  pcStack_38 = (char *)(ulong)(uint)size;
  pCStack_30 = pCVar4;
  if (iVar6 < 1) {
    aStack_58._M_b._M_p = (__base_type)(__pointer_type)0x266a6e;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar6,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if ((char)_Var5._M_p != '\0') {
      return;
    }
    internal::LongSooRep::elements(this_01);
    return;
  }
  this_02 = &SStack_48;
  aStack_58._M_b._M_p = (__base_type)(__pointer_type)0x266a7d;
  RepeatedField<unsigned_long>::elements();
  this_03 = (Arena *)auStack_78;
  iVar6 = (int)psVar2;
  lVar3 = (long)iVar6;
  auStack_78._16_8_ = this_01;
  _Stack_60._M_i = (__int_type_conflict1)this;
  aStack_58._M_b._M_p = (__base_type)(__base_type)_Var5._M_p;
  if (iVar6 < 0) {
    pSStack_80 = (SooRep *)0x266ae6;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar3,0,"index >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    pSStack_80 = (SooRep *)0x266aab;
    iVar1 = internal::SooRep::size
                      (this_02,(undefined1  [16])
                               ((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    if (iVar6 < iVar1) {
      psVar2 = (string *)0x0;
    }
    else {
      pSStack_80 = (SooRep *)0x266afa;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar3,(long)iVar1,"index < size()");
    }
    if (psVar2 == (string *)0x0) {
      pSStack_80 = (SooRep *)0x266ac8;
      RepeatedField<unsigned_long>::elements
                ((RepeatedField<unsigned_long> *)this_02,
                 (undefined1  [16])((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  else {
    pSStack_80 = (SooRep *)0x266b07;
    RepeatedField<unsigned_long>::Mutable();
  }
  pSStack_80 = (SooRep *)
               Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>;
  RepeatedField<unsigned_long>::Mutable();
  lStack_88 = lVar3;
  pSStack_80 = this_02;
  if (this_03 == (Arena *)0x0) {
    this_00 = (RepeatedField<unsigned_long> *)operator_new(0x10);
    RepeatedField<unsigned_long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_03,0x10);
    pAStack_90 = this_03;
    Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_90);
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }